

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentBG.cpp
# Opt level: O1

BGPolicyIndex __thiscall AgentBG::GetMaximizingBGIndex(AgentBG *this,JointBeliefInterface *jb)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  BGPolicyIndex BVar5;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  BGPolicyIndex bI;
  double local_40;
  BGPolicyIndex local_38;
  undefined1 auVar6 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  lVar1 = (**(code **)((long)*(((this->super_AgentDelayedSharedObservations).
                                super_AgentDecPOMDPDiscrete._m_pu)->super_PlanningUnitMADPDiscrete).
                              _m_madp + 0x68))();
  if (lVar1 == 0) {
    BVar5 = 0x7fffffff;
  }
  else {
    local_40 = -1.79769313486232e+308;
    BVar5 = 0x7fffffff;
    uVar4 = 1;
    do {
      if (this->_m_QBGstationary == (QAV<PerseusBGPlanner> *)0x0) {
        auVar8._0_8_ = (**(code **)(*(long *)(*(long *)(this->_m_QBGnonStationary + 8) + 0x18) +
                                   0x58))(*(long *)(this->_m_QBGnonStationary + 8) + 0x18,jb,
                                          (int)this->_m_t,uVar4 - 1,&local_38);
        auVar8._8_56_ = extraout_var_00;
        auVar6 = auVar8._0_16_;
      }
      else {
        lVar1 = *(long *)(this->_m_QBGstationary + 8);
        auVar7._0_8_ = (**(code **)(*(long *)(lVar1 + 0x18) + 0x48))
                                 (lVar1 + 0x18,jb,uVar4 - 1,&local_38);
        auVar7._8_56_ = extraout_var;
        auVar6 = auVar7._0_16_;
      }
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_40;
      if (local_40 < auVar6._0_8_) {
        BVar5 = local_38;
      }
      auVar6 = vmaxsd_avx(auVar6,auVar9);
      local_40 = auVar6._0_8_;
      uVar3 = (ulong)uVar4;
      uVar2 = (**(code **)((long)*(((this->super_AgentDelayedSharedObservations).
                                    super_AgentDecPOMDPDiscrete._m_pu)->
                                  super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar3);
  }
  return BVar5;
}

Assistant:

AlphaVector::BGPolicyIndex
AgentBG::GetMaximizingBGIndex(const JointBeliefInterface &jb) const
{
    double v=-DBL_MAX,q;
    AlphaVector::BGPolicyIndex bI,betaMaxI=INT_MAX;

    for(Index a=0;a!=GetPU()->GetNrJointActions();++a)
    {
        if(_m_QBGstationary)
            q=_m_QBGstationary->GetQ(jb,a,bI);
        else
            q=_m_QBGnonStationary->GetQ(jb,_m_t,a,bI);

        if(q>v)
        {
            v=q;
            betaMaxI=bI;
        }
    }

#if DEBUG_AgentBG
    cout << "GetMaximizingBGIndex " << GetIndex() << ": betaMaxI " << betaMaxI 
         << " " << jb.SoftPrint() << endl;
#endif
    return(betaMaxI);
}